

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

String * __thiscall
Rml::Parse::VariableOrFunctionName_abi_cxx11_
          (String *__return_storage_ptr__,Parse *this,DataParser *parser,
          bool *out_valid_function_name)

{
  bool bVar1;
  long lVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  bool bVar7;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this[0x40] == (Parse)0x0) {
    bVar3 = *(byte *)(*(long *)this + *(long *)(this + 0x38));
  }
  else {
    bVar3 = 0;
  }
  bVar1 = true;
  do {
    bVar6 = (bVar3 & 0xdf) + 0xbf;
    bVar7 = bVar6 < 0x1a;
    if (bVar1) {
LAB_001f3528:
      if (!bVar7) {
        if (parser != (DataParser *)0x0) {
          lVar4 = ::std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x2d57e3,0);
          *(bool *)&(parser->expression)._M_dataplus._M_p = lVar4 == -1;
        }
        return __return_storage_ptr__;
      }
    }
    else if ((bVar3 != 0x5f && 9 < (byte)(bVar3 - 0x30)) && 0x19 < bVar6) {
      lVar4 = 0;
      do {
        bVar7 = lVar4 != 2;
        if (lVar4 == 2) break;
        lVar2 = lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while ("_."[lVar2] == 0 || "_."[lVar2] != bVar3);
      goto LAB_001f3528;
    }
    ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    uVar5 = *(long *)(this + 0x38) + 1;
    *(ulong *)(this + 0x38) = uVar5;
    if (*(ulong *)(this + 8) <= uVar5) {
      this[0x40] = (Parse)0x1;
    }
    bVar3 = 0;
    bVar1 = false;
    if (this[0x40] == (Parse)0x0) {
      bVar3 = *(byte *)(*(long *)this + uVar5);
      bVar1 = false;
    }
  } while( true );
}

Assistant:

static String VariableOrFunctionName(DataParser& parser, bool* out_valid_function_name)
	{
		String name;
		bool is_first_character = true;
		char c = parser.Look();

		while (IsVariableCharacter(c, is_first_character))
		{
			name += c;
			c = parser.Next();
			is_first_character = false;
		}

		if (out_valid_function_name)
			*out_valid_function_name = (name.find_first_of(". ") == String::npos);

		return name;
	}